

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportfields.cpp
# Opt level: O2

void __thiscall ReportFields::setDefaults(ReportFields *this)

{
  Field *pFVar1;
  int i;
  long lVar2;
  int i_1;
  ReportFields *pRVar3;
  
  pRVar3 = this;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    std::__cxx11::string::assign((char *)pRVar3);
    pRVar3->nodeFields[0].precision = 3;
    pRVar3->nodeFields[0].lowerLimit = 2.2250738585072014e-308;
    pRVar3->nodeFields[0].upperLimit = 1.79769313486232e+308;
    pRVar3 = (ReportFields *)(pRVar3->nodeFields + 1);
  }
  pFVar1 = this->linkFields;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    std::__cxx11::string::assign((char *)pFVar1);
    pFVar1->precision = 3;
    pFVar1->lowerLimit = 1.79769313486232e+308;
    pFVar1->upperLimit = 2.2250738585072014e-308;
    pFVar1 = pFVar1 + 1;
  }
  return;
}

Assistant:

void ReportFields::setDefaults()
{
    for (int i = 0; i < NUM_NODE_FIELDS; i++)
    {
        nodeFields[i].name = NodeFieldNames[i];
        nodeFields[i].precision = 3;
        nodeFields[i].lowerLimit = numeric_limits<double>::min();
        nodeFields[i].upperLimit = numeric_limits<double>::max();
    }
    for (int i = 0; i < NUM_LINK_FIELDS; i++)
    {
        linkFields[i].name = LinkFieldNames[i];
        linkFields[i].precision = 3;
        linkFields[i].lowerLimit = numeric_limits<double>::max();
        linkFields[i].upperLimit = numeric_limits<double>::min();
    }
}